

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderArguments
          (ConversionStream *this,iterator *TypeToken,
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          *Params,String *Globals,stringstream *ReturnHandlerSS,String *Prologue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StorageQualifier SVar2;
  InOutPatchType IVar3;
  bool bVar4;
  ShaderParameterInfo *pSVar5;
  HLSL2GLSLConverterImpl *pHVar6;
  pointer pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  __node_base_ptr p_Var14;
  size_t sVar15;
  ostream *poVar16;
  pointer pSVar17;
  undefined8 *puVar18;
  long *plVar19;
  ConversionStream *pCVar20;
  _Hash_node_base *p_Var21;
  pointer pSVar22;
  ulong uVar23;
  undefined8 uVar24;
  __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
  *p_Var25;
  char *pcVar26;
  pointer pSVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  _Hash_node_base *p_Var29;
  string msg;
  bool bConstFuncTakesInputPatch;
  String GLSLVariable;
  String VarName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  vector<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
  MemberItStack_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> InputVarName;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  MemberStack;
  vector<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
  MemberItStack;
  unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  Attributes;
  iterator Token;
  stringstream PrologueSS;
  stringstream GlobalsSS;
  stringstream InterfaceVarsOutSS;
  stringstream InterfaceVarsInSS;
  undefined1 local_7e0 [39];
  bool local_7b9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8;
  __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
  *local_7a8;
  _Alloc_hider _Stack_7a0;
  undefined1 local_798 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_788;
  undefined1 local_778 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_768;
  pointer local_758;
  undefined1 auStack_750 [16];
  _Alloc_hider _Stack_740;
  undefined1 local_738 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  local_718;
  void *local_6f8;
  iterator iStack_6f0;
  __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
  *local_6e8;
  int local_6d8;
  int local_6d4;
  stringstream *local_6d0;
  ConversionStream *local_6c8;
  char *local_6c0;
  String *local_6b8;
  String *local_6b0;
  _Hash_node_base *local_6a8;
  char *local_6a0;
  pointer local_698;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_690;
  iterator local_658;
  stringstream local_650 [16];
  long local_640 [14];
  ios_base aiStack_5d0 [264];
  key_type local_4c8;
  long local_4b8 [14];
  ios_base aiStack_448 [264];
  stringstream local_340 [128];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [128];
  ios_base aiStack_138 [264];
  
  local_658 = (iterator)TypeToken->_M_node;
  local_690._M_buckets = &local_690._M_single_bucket;
  local_690._M_bucket_count = 1;
  local_690._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_690._M_element_count = 0;
  local_690._M_rehash_policy._M_max_load_factor = 1.0;
  local_690._M_rehash_policy._M_next_resize = 0;
  local_690._M_single_bucket = (__node_base_ptr)0x0;
  local_6d0 = ReturnHandlerSS;
  ProcessShaderAttributes
            (this,&local_658,
             (unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_690);
  local_4c8.Str = "domain";
  local_4c8.Ownership_Hash = 0xcaaeccf1c670984;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_690._M_bucket_count;
  p_Var14 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_690,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xcaaeccf1c670984)) % auVar8,0),
                       &local_4c8,0xcaaeccf1c670984);
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var21 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var21 = p_Var14->_M_nxt;
  }
  if ((local_4c8.Str != (char *)0x0) && ((long)local_4c8.Ownership_Hash < 0)) {
    operator_delete__(local_4c8.Str);
  }
  if (p_Var21 != (_Hash_node_base *)0x0) {
    pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var21 + 3);
    iVar13 = std::__cxx11::string::compare((char *)pbVar28);
    if (((iVar13 != 0) && (iVar13 = std::__cxx11::string::compare((char *)pbVar28), iVar13 != 0)) &&
       (iVar13 = std::__cxx11::string::compare((char *)pbVar28), iVar13 != 0)) {
      LogError<true,char[26],std::__cxx11::string,char[55]>
                (false,"ProcessHullShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xe1b,(char (*) [26])"Unexpected domain value \"",pbVar28,
                 (char (*) [55])"\". String constant \"tri\", \"quad\" or \"isoline\" expected");
    }
  }
  local_4c8.Str = "partitioning";
  local_4c8.Ownership_Hash = 0x2779e7fde7b9e178;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_690._M_bucket_count;
  p_Var14 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_690,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x2779e7fde7b9e178)) % auVar9,0),
                       &local_4c8,0x2779e7fde7b9e178);
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var21 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var21 = p_Var14->_M_nxt;
  }
  if ((local_4c8.Str != (char *)0x0) && ((long)local_4c8.Ownership_Hash < 0)) {
    operator_delete__(local_4c8.Str);
  }
  if (p_Var21 != (_Hash_node_base *)0x0) {
    pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var21 + 3);
    iVar13 = std::__cxx11::string::compare((char *)pbVar28);
    if (((iVar13 != 0) && (iVar13 = std::__cxx11::string::compare((char *)pbVar28), iVar13 != 0)) &&
       ((iVar13 = std::__cxx11::string::compare((char *)pbVar28), iVar13 != 0 &&
        (iVar13 = std::__cxx11::string::compare((char *)pbVar28), iVar13 != 0)))) {
      LogError<true,char[26],std::__cxx11::string,char[86]>
                (false,"ProcessHullShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xe2a,(char (*) [26])"Unexpected partitioning \"",pbVar28,
                 (char (*) [86])
                 "\". String constant \"integer\", \"fractional_even\", \"fractional_odd\", or \"pow2\" expected"
                );
    }
  }
  local_4c8.Str = "outputtopology";
  local_4c8.Ownership_Hash = 0x507bd7cd66e764d0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_690._M_bucket_count;
  p_Var14 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_690,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x507bd7cd66e764d0)) % auVar10,0),
                       &local_4c8,0x507bd7cd66e764d0);
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var21 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var21 = p_Var14->_M_nxt;
  }
  if ((local_4c8.Str != (char *)0x0) && ((long)local_4c8.Ownership_Hash < 0)) {
    operator_delete__(local_4c8.Str);
  }
  if (p_Var21 != (_Hash_node_base *)0x0) {
    pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var21 + 3);
    iVar13 = std::__cxx11::string::compare((char *)pbVar28);
    if ((((iVar13 != 0) && (iVar13 = std::__cxx11::string::compare((char *)pbVar28), iVar13 != 0))
        && (iVar13 = std::__cxx11::string::compare((char *)pbVar28), iVar13 != 0)) &&
       (iVar13 = std::__cxx11::string::compare((char *)pbVar28), iVar13 != 0)) {
      LogError<true,char[22],std::__cxx11::string,char[78]>
                (false,"ProcessHullShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xe39,(char (*) [22])"Unexpected topology \"",pbVar28,
                 (char (*) [78])
                 "\". String constant \"point\", \"line\", \"triangle_cw\", or \"triangle_ccw\" expected"
                );
    }
  }
  local_4c8.Str = "patchconstantfunc";
  local_4c8.Ownership_Hash = 0x11f5e5b0fee478d0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_690._M_bucket_count;
  p_Var14 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_690,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x11f5e5b0fee478d0)) % auVar11,0),
                       &local_4c8,0x11f5e5b0fee478d0);
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var21 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var21 = p_Var14->_M_nxt;
  }
  local_6b0 = Prologue;
  if ((local_4c8.Str != (char *)0x0) && ((long)local_4c8.Ownership_Hash < 0)) {
    operator_delete__(local_4c8.Str);
  }
  if (p_Var21 == (_Hash_node_base *)0x0) {
    LogError<true,char[88]>
              (false,"ProcessHullShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xe3e,(char (*) [88])
                      "Hull shader patch constant function is not specified. Use \"patchconstantfunc\" attribute"
              );
  }
  local_4c8.Str = "outputcontrolpoints";
  local_4c8.Ownership_Hash = 0x653d806a61a429df;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_690._M_bucket_count;
  p_Var14 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_690,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x653d806a61a429df)) % auVar12,0),
                       &local_4c8,0x653d806a61a429df);
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var29 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var29 = p_Var14->_M_nxt;
  }
  if ((local_4c8.Str != (char *)0x0) && ((long)local_4c8.Ownership_Hash < 0)) {
    operator_delete__(local_4c8.Str);
  }
  local_6b8 = Globals;
  if (p_Var29 == (_Hash_node_base *)0x0) {
    LogError<true,char[86]>
              (false,"ProcessHullShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xe43,(char (*) [86])
                      "Number of output control points is not specified. Use \"outputcontrolpoints\" attribute"
              );
  }
  p_Var29 = p_Var29[3]._M_nxt;
  local_7b9 = false;
  local_6a8 = p_Var21[3]._M_nxt;
  ProcessHullShaderConstantFunction(this,(Char *)local_6a8,&local_7b9);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_4c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"layout(vertices = ",0x12)
  ;
  if (p_Var29 == (_Hash_node_base *)0x0) {
    std::ios::clear((int)(ostream *)local_4b8 + (int)*(undefined8 *)(local_4b8[0] + -0x18));
  }
  else {
    sVar15 = strlen((char *)p_Var29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,(char *)p_Var29,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,") out;\n",7);
  std::__cxx11::stringstream::stringstream(local_650);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  pSVar22 = (Params->
            super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_698 = (Params->
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar22 != local_698) {
    local_6d0 = local_6d0 + 0x10;
    local_6d8 = 0;
    local_6d4 = 0;
    local_6c8 = this;
    do {
      SVar2 = pSVar22->storageQualifier;
      if ((SVar2 == Ret) || (SVar2 == Out)) {
        local_7b8._M_allocated_capacity = 0;
        local_7b8._8_8_ = (pointer)0x0;
        local_7a8 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                     *)0x0;
        auStack_750._8_8_ =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_758 = (pointer)0x0;
        auStack_750._0_8_ =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_7e0._0_8_ = pSVar22;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)local_7b8._M_local_buf,(iterator)0x0,(ShaderParameterInfo **)local_7e0);
        local_7e0._0_8_ =
             (pSVar22->members).
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (auStack_750._0_8_ == auStack_750._8_8_) {
          std::
          vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                    ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                      *)&local_758,(iterator)auStack_750._0_8_,
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)local_7e0);
        }
        else {
          *(undefined8 *)auStack_750._0_8_ = local_7e0._0_8_;
          auStack_750._0_8_ = auStack_750._0_8_ + 8;
        }
        if (((pSVar22->storageQualifier != Ret) && ((pSVar22->GSAttribs).PrimType == Undefined)) &&
           ((pSVar22->HSAttribs).PatchType == Undefined)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    ",4);
          pcVar26 = (pSVar22->Type)._M_dataplus._M_p;
          if (pcVar26 == (char *)0x0) {
            std::ios::clear((int)local_640 + (int)*(undefined8 *)(local_640[0] + -0x18));
          }
          else {
            sVar15 = strlen(pcVar26);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,pcVar26,sVar15);
          }
          local_7e0[0] = (string)0x20;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_640,local_7e0,1);
          pcVar26 = (pSVar22->Name)._M_dataplus._M_p;
          if (pcVar26 == (char *)0x0) {
            std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
          }
          else {
            sVar15 = strlen(pcVar26);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar26,sVar15);
          }
          if ((pSVar22->ArraySize)._M_string_length != 0) {
            local_7e0[0] = (string)0x5b;
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_640,local_7e0,1);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,(pSVar22->ArraySize)._M_dataplus._M_p,
                                 (pSVar22->ArraySize)._M_string_length);
            local_7e0[0] = (string)0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_7e0,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,";\n",2);
        }
        while (local_7b8._M_allocated_capacity != local_7b8._8_8_) {
          pSVar5 = *(pointer *)(local_7b8._8_8_ + -8);
          pSVar27 = (pSVar5->members).
                    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar17 = *(pointer *)
                     ((long)&(pSVar5->members).
                             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                             ._M_impl.super__Vector_impl_data + 8);
          if (pSVar27 == pSVar17) {
            if (((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                  *)(auStack_750._0_8_ + -8))->_M_current != pSVar27) {
              FormatString<char[26],char[49]>
                        ((string *)local_7e0,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                         (char (*) [49])pSVar27);
              DebugAssertionFailed
                        ((Char *)local_7e0._0_8_,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb19);
              if ((pointer)local_7e0._0_8_ != (pointer)(local_7e0 + 0x10)) {
                operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
              }
            }
            if ((pSVar5->Semantic)._M_string_length == 0) {
              LogError<true,char[36],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar5->Name,
                         (char (*) [2])0x6f3e07);
            }
            local_778._0_8_ = &local_768;
            local_778._8_8_ = 0;
            local_768._M_local_buf[0] = '\0';
            pHVar6 = this->m_Converter;
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)local_7e0,(pSVar5->Semantic)._M_dataplus._M_p,false);
            pCVar20 = (ConversionStream *)
                      ((local_7e0._8_8_ & 0x7fffffffffffffff) %
                      (pHVar6->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[1]._M_h._M_bucket_count
                      );
            p_Var14 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_before_node
                                (&(pHVar6->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[1]._M_h,
                                 (size_type)pCVar20,(HashMapStringKey *)local_7e0,
                                 local_7e0._8_8_ & 0x7fffffffffffffff);
            if (p_Var14 == (__node_base_ptr)0x0) {
              p_Var21 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var21 = p_Var14->_M_nxt;
            }
            if (((pointer)local_7e0._0_8_ != (pointer)0x0) && ((long)local_7e0._8_8_ < 0)) {
              operator_delete__((void *)local_7e0._0_8_);
            }
            if (p_Var21 != (_Hash_node_base *)0x0) {
              pCVar20 = (ConversionStream *)(p_Var21 + 3);
              std::__cxx11::string::_M_assign((string *)local_778);
            }
            pcVar26 = "";
            if (pSVar5->storageQualifier == Ret) {
              pcVar26 = "_RET_VAL_";
            }
            BuildParameterName_abi_cxx11_
                      ((String *)local_7e0,pCVar20,
                       (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                        *)&local_7b8,'.',"",pcVar26,"");
            if (local_778._8_8_ == 0) {
              pcVar26 = "_";
              if (this->m_bUseInOutLocationQualifiers != false) {
                pcVar26 = "_hsout_";
              }
              BuildParameterName_abi_cxx11_
                        ((String *)local_798,pCVar20,
                         (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                          *)&local_7b8,'_',pcVar26,"","");
              bVar4 = this->m_bUseInOutLocationQualifiers;
              iVar13 = -1;
              if (bVar4 != false) {
                iVar13 = local_6d4;
              }
              pcVar26 = GetInterpolationQualifier(this,pSVar5);
              local_738._0_8_ = &local_728;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_738,local_798._0_8_,
                         (char *)(local_798._0_8_ + local_798._8_8_));
              std::__cxx11::string::append((char *)local_738);
              DefineInterfaceVar(iVar13,pcVar26,"out",&pSVar5->Type,(String *)local_738,
                                 (stringstream *)local_340);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_738._0_8_ != &local_728) {
                operator_delete((void *)local_738._0_8_,local_728._0_8_ + 1);
              }
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_6d0,(char *)local_798._0_8_,local_798._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,"[gl_InvocationID] = ",0x14);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,(char *)local_7e0._0_8_,local_7e0._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\\\n",3);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_798._0_8_ != &local_788) {
                operator_delete((void *)local_798._0_8_,local_788._0_8_ + 1);
              }
              local_6d4 = local_6d4 + (uint)bVar4;
              this = local_6c8;
            }
            else {
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_6d0,(char *)local_778._0_8_,local_778._8_8_);
              local_798[0] = 0x28;
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_798,1);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,(char *)local_7e0._0_8_,local_7e0._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,");\\\n",4);
            }
            if ((pointer)local_7e0._0_8_ != (pointer)(local_7e0 + 0x10)) {
              operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
            }
            local_7b8._8_8_ = local_7b8._8_8_ + -8;
            auStack_750._0_8_ = auStack_750._0_8_ + -8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_778._0_8_ != &local_768) {
              operator_delete((void *)local_778._0_8_,
                              CONCAT71(local_768._1_7_,local_768._M_local_buf[0]) + 1);
            }
          }
          else {
            if ((pSVar5->Semantic)._M_string_length != 0) {
              LogError<true,char[35],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar5->Name,
                         (char (*) [2])0x6f3e07);
              pSVar17 = *(pointer *)
                         ((long)&(pSVar5->members).
                                 super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                                 ._M_impl.super__Vector_impl_data + 8);
            }
            pSVar27 = ((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                        *)(auStack_750._0_8_ + -8))->_M_current;
            if (pSVar27 == pSVar17) {
              local_7b8._8_8_ = local_7b8._8_8_ + -8;
              auStack_750._0_8_ =
                   (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                    *)(auStack_750._0_8_ + -8);
            }
            else {
              ((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                *)(auStack_750._0_8_ + -8))->_M_current = pSVar27 + 1;
              if ((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                   *)local_7b8._8_8_ == local_7a8) {
                local_7e0._0_8_ = pSVar27;
                std::
                vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                ::
                _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                          ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                            *)local_7b8._M_local_buf,(iterator)local_7b8._8_8_,
                           (ShaderParameterInfo **)local_7e0);
              }
              else {
                *(pointer *)local_7b8._8_8_ = pSVar27;
                local_7b8._8_8_ = local_7b8._8_8_ + 8;
              }
              local_7e0._0_8_ =
                   (pSVar27->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (auStack_750._0_8_ == auStack_750._8_8_) {
                std::
                vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                ::
                _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                          ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                            *)&local_758,(iterator)auStack_750._0_8_,
                           (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                            *)local_7e0);
              }
              else {
                *(undefined8 *)auStack_750._0_8_ = local_7e0._0_8_;
                auStack_750._0_8_ =
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)(auStack_750._0_8_ + 8);
              }
            }
          }
        }
        if (local_758 != (pointer)0x0) {
          operator_delete(local_758,auStack_750._8_8_ - (long)local_758);
        }
        if ((pointer)local_7b8._M_allocated_capacity != (pointer)0x0) {
          uVar23 = (long)local_7a8 - local_7b8._0_8_;
          uVar24 = local_7b8._M_allocated_capacity;
LAB_002db30b:
          operator_delete((void *)uVar24,uVar23);
        }
      }
      else if (SVar2 == In) {
        IVar3 = (pSVar22->HSAttribs).PatchType;
        if (IVar3 == InputPatch) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_640,"    const int _NumInputPoints = ",0x20);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_640,(pSVar22->ArraySize)._M_dataplus._M_p,
                               (pSVar22->ArraySize)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    ",4);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_640,(pSVar22->Type)._M_dataplus._M_p,
                               (pSVar22->Type)._M_string_length);
          local_7e0[0] = (string)0x20;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_7e0,1);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,(pSVar22->Name)._M_dataplus._M_p,
                               (pSVar22->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"[_NumInputPoints];\n",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_640,"    for(int i=0; i < gl_PatchVerticesIn; ++i)\n    {\n",
                     0x34);
        }
        local_718.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (ShaderParameterInfo **)0x0;
        local_718.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_718.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_6e8 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                     *)0x0;
        local_6f8 = (void *)0x0;
        iStack_6f0._M_current =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_7e0._0_8_ = pSVar22;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)&local_718,(iterator)0x0,(ShaderParameterInfo **)local_7e0);
        local_7e0._0_8_ =
             (pSVar22->members).
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (iStack_6f0._M_current == local_6e8) {
          std::
          vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                    ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                      *)&local_6f8,iStack_6f0,
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)local_7e0);
        }
        else {
          (iStack_6f0._M_current)->_M_current = (ShaderParameterInfo *)local_7e0._0_8_;
          iStack_6f0._M_current = iStack_6f0._M_current + 1;
        }
        if (((pSVar22->storageQualifier != Ret) && ((pSVar22->GSAttribs).PrimType == Undefined)) &&
           ((pSVar22->HSAttribs).PatchType == Undefined)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    ",4);
          pcVar26 = (pSVar22->Type)._M_dataplus._M_p;
          if (pcVar26 == (char *)0x0) {
            std::ios::clear((int)local_640 + (int)*(undefined8 *)(local_640[0] + -0x18));
          }
          else {
            sVar15 = strlen(pcVar26);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,pcVar26,sVar15);
          }
          local_7e0[0] = (string)0x20;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_640,local_7e0,1);
          pcVar26 = (pSVar22->Name)._M_dataplus._M_p;
          if (pcVar26 == (char *)0x0) {
            std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
          }
          else {
            sVar15 = strlen(pcVar26);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar26,sVar15);
          }
          if ((pSVar22->ArraySize)._M_string_length != 0) {
            local_7e0[0] = (string)0x5b;
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_640,local_7e0,1);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,(pSVar22->ArraySize)._M_dataplus._M_p,
                                 (pSVar22->ArraySize)._M_string_length);
            local_7e0[0] = (string)0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_7e0,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,";\n",2);
        }
        if (local_718.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_718.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_6c0 = "";
          if (IVar3 == InputPatch) {
            local_6c0 = "[i]";
          }
          local_6a0 = "";
          if (IVar3 == InputPatch) {
            local_6a0 = "[]";
          }
          do {
            pSVar5 = *(pointer *)
                      ((long)&(((pointer)
                               ((long)local_718.
                                      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -0xa0))->members)
                              .
                              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                              ._M_impl + 0x10);
            pSVar27 = (pSVar5->members).
                      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pSVar17 = (pSVar5->members).
                      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pSVar27 == pSVar17) {
              if (iStack_6f0._M_current[-1]._M_current != pSVar27) {
                FormatString<char[26],char[49]>
                          ((string *)local_7e0,(Diligent *)"Debug expression failed:\n",
                           (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                           (char (*) [49])pSVar27);
                DebugAssertionFailed
                          ((Char *)local_7e0._0_8_,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb19);
                if ((pointer)local_7e0._0_8_ != (pointer)(local_7e0 + 0x10)) {
                  operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
                }
              }
              if ((pSVar5->Semantic)._M_string_length == 0) {
                LogError<true,char[36],std::__cxx11::string,char[2]>
                          (false,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",
                           &pSVar5->Name,(char (*) [2])0x6f3e07);
              }
              local_7b8._M_allocated_capacity = (size_type)&local_7a8;
              local_7b8._8_8_ =
                   (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                    *)0x0;
              local_7a8 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                           *)((ulong)local_7a8 & 0xffffffffffffff00);
              pHVar6 = this->m_Converter;
              HashMapStringKey::HashMapStringKey
                        ((HashMapStringKey *)local_7e0,(pSVar5->Semantic)._M_dataplus._M_p,false);
              pCVar20 = (ConversionStream *)
                        ((local_7e0._8_8_ & 0x7fffffffffffffff) %
                        (pHVar6->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[0]._M_h.
                        _M_bucket_count);
              p_Var14 = std::
                        _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::_M_find_before_node
                                  ((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                    *)((pHVar6->m_HLSLSemanticToGLSLVar)._M_elems + 3),
                                   (size_type)pCVar20,(HashMapStringKey *)local_7e0,
                                   local_7e0._8_8_ & 0x7fffffffffffffff);
              if (p_Var14 == (__node_base_ptr)0x0) {
                p_Var21 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var21 = p_Var14->_M_nxt;
              }
              if (((pointer)local_7e0._0_8_ != (pointer)0x0) && ((long)local_7e0._8_8_ < 0)) {
                operator_delete__((void *)local_7e0._0_8_);
              }
              if (p_Var21 != (_Hash_node_base *)0x0) {
                pCVar20 = (ConversionStream *)(p_Var21 + 3);
                std::__cxx11::string::_M_assign((string *)local_7b8._M_local_buf);
              }
              local_758 = (pointer)(auStack_750 + 8);
              if ((pointer)local_7b8._M_allocated_capacity == (pointer)&local_7a8) {
                _Stack_740._M_p = _Stack_7a0._M_p;
              }
              else {
                local_758 = (pointer)local_7b8._M_allocated_capacity;
              }
              auStack_750._8_8_ = local_7a8;
              auStack_750._0_8_ = local_7b8._8_8_;
              local_7b8._8_8_ = (pointer)0x0;
              local_7a8 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                           *)((ulong)local_7a8 & 0xffffffffffffff00);
              local_7b8._M_allocated_capacity = (size_type)(pointer)&local_7a8;
              BuildParameterName_abi_cxx11_
                        ((String *)local_7e0,pCVar20,&local_718,'.',"","",local_6c0);
              if (IVar3 == InputPatch) {
                pCVar20 = (ConversionStream *)0x6c8d3e;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    ",4);
              }
              if ((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                   *)auStack_750._0_8_ ==
                  (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                   *)0x0) {
                pcVar26 = "_";
                if (this->m_bUseInOutLocationQualifiers != false) {
                  pcVar26 = "_hsin_";
                }
                BuildParameterName_abi_cxx11_
                          ((String *)local_798,pCVar20,&local_718,'_',pcVar26,"","");
                local_738._0_8_ = &local_728;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_738,local_798._0_8_,
                           (char *)(local_798._0_8_ + local_798._8_8_));
                std::__cxx11::string::append((char *)local_738);
                bVar4 = this->m_bUseInOutLocationQualifiers;
                iVar13 = -1;
                if (bVar4 != false) {
                  iVar13 = local_6d8;
                }
                pcVar26 = GetInterpolationQualifier(this,pSVar5);
                local_778._0_8_ = &local_768;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_778,local_798._0_8_,
                           (char *)(local_798._0_8_ + local_798._8_8_));
                std::__cxx11::string::append((char *)local_778);
                DefineInterfaceVar(iVar13,pcVar26,"in",&pSVar5->Type,(String *)local_778,
                                   (stringstream *)local_1b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_778._0_8_ != &local_768) {
                  operator_delete((void *)local_778._0_8_,
                                  CONCAT71(local_768._1_7_,local_768._M_local_buf[0]) + 1);
                }
                InitVariable((String *)local_7e0,(String *)local_738,(stringstream *)local_650);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_738._0_8_ != &local_728) {
                  operator_delete((void *)local_738._0_8_,local_728._0_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_798._0_8_ != &local_788) {
                  operator_delete((void *)local_798._0_8_,local_788._0_8_ + 1);
                }
                local_6d8 = local_6d8 + (uint)bVar4;
                this = local_6c8;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    ",4);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_640,(char *)local_758,auStack_750._0_8_);
                local_798[0] = 0x28;
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_798,1);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,(char *)local_7e0._0_8_,local_7e0._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,");\n",3);
              }
              if ((pointer)local_7e0._0_8_ != (pointer)(local_7e0 + 0x10)) {
                operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
              }
              if (local_758 != (pointer)(auStack_750 + 8)) {
                operator_delete(local_758,(ulong)(auStack_750._8_8_ + 1));
              }
              local_718.
              super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((long)&(((pointer)
                                     ((long)local_718.
                                            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + -0xa0))->
                                    members).
                                    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                                    ._M_impl + 0x10);
              iStack_6f0._M_current = iStack_6f0._M_current + -1;
              if ((pointer)local_7b8._M_allocated_capacity != (pointer)&local_7a8) {
                operator_delete((void *)local_7b8._M_allocated_capacity,(long)local_7a8 + 1);
              }
            }
            else {
              if ((pSVar5->Semantic)._M_string_length != 0) {
                LogError<true,char[35],std::__cxx11::string,char[2]>
                          (false,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar5->Name
                           ,(char (*) [2])0x6f3e07);
                pSVar17 = (pSVar5->members).
                          super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              pSVar27 = iStack_6f0._M_current[-1]._M_current;
              if (pSVar27 == pSVar17) {
                local_718.
                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_718.
                     super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
                iStack_6f0._M_current = iStack_6f0._M_current + -1;
              }
              else {
                iStack_6f0._M_current[-1]._M_current = pSVar27 + 1;
                if (local_718.
                    super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_718.
                    super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  local_7e0._0_8_ = pSVar27;
                  std::
                  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                  ::
                  _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                            ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                              *)&local_718,
                             (iterator)
                             local_718.
                             super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (ShaderParameterInfo **)local_7e0);
                }
                else {
                  *local_718.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish = pSVar27;
                  local_718.
                  super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       local_718.
                       super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
                local_7e0._0_8_ =
                     (pSVar27->members).
                     super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                if (iStack_6f0._M_current == local_6e8) {
                  std::
                  vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                  ::
                  _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                            ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                              *)&local_6f8,iStack_6f0,
                             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                              *)local_7e0);
                }
                else {
                  (iStack_6f0._M_current)->_M_current = (ShaderParameterInfo *)local_7e0._0_8_;
                  iStack_6f0._M_current = iStack_6f0._M_current + 1;
                }
              }
            }
          } while (local_718.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   local_718.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        pSVar27 = (pointer)(local_7e0 + 0x10);
        if (local_6f8 != (void *)0x0) {
          operator_delete(local_6f8,(long)local_6e8 - (long)local_6f8);
        }
        if ((pointer)local_718.
                     super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_718.
                          super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_718.
                                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_718.
                                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (IVar3 == InputPatch) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    }\n",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    ",4);
          p_Var21 = local_6a8;
          if (local_6a8 == (_Hash_node_base *)0x0) {
            std::ios::clear((int)local_640 + (int)*(undefined8 *)(local_640[0] + -0x18));
          }
          else {
            sVar15 = strlen((char *)local_6a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_640,(char *)p_Var21,sVar15);
          }
          local_7e0[0] = (string)0x28;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_640,local_7e0,1);
          local_7e0._0_8_ = pSVar27;
          if (local_7b9 == true) {
            pcVar7 = (pSVar22->Name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_7e0,pcVar7,pcVar7 + (pSVar22->Name)._M_string_length);
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"");
          }
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,(char *)local_7e0._0_8_,local_7e0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,");\n",3);
          if ((pointer)local_7e0._0_8_ != pSVar27) {
            uVar23 = local_7e0._16_8_ + 1;
            uVar24 = local_7e0._0_8_;
            goto LAB_002db30b;
          }
        }
      }
      pSVar22 = pSVar22 + 1;
    } while (pSVar22 != local_698);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_6b0,(string *)local_7e0);
  pSVar22 = (pointer)(local_7e0 + 0x10);
  if ((pointer)local_7e0._0_8_ != pSVar22) {
    operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  uVar24 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._0_8_ != &local_728) {
    uVar24 = local_728._0_8_;
  }
  if ((ulong)uVar24 < (ulong)(local_778._8_8_ + local_738._8_8_)) {
    uVar23 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778._0_8_ != &local_768) {
      uVar23 = CONCAT71(local_768._1_7_,local_768._M_local_buf[0]);
    }
    if (uVar23 < (ulong)(local_778._8_8_ + local_738._8_8_)) goto LAB_002dbc87;
    puVar18 = (undefined8 *)
              std::__cxx11::string::replace((ulong)local_778,0,(char *)0x0,local_738._0_8_);
  }
  else {
LAB_002dbc87:
    puVar18 = (undefined8 *)std::__cxx11::string::_M_append(local_738,local_778._0_8_);
  }
  local_798._0_8_ = &local_788;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar18 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar18 == paVar1) {
    local_788._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_788._8_8_ = puVar18[3];
  }
  else {
    local_788._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_798._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar18;
  }
  local_798._8_8_ = puVar18[1];
  *puVar18 = paVar1;
  puVar18[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  uVar24 = (ShaderParameterInfo **)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._0_8_ != &local_788) {
    uVar24 = local_788._0_8_;
  }
  if ((ulong)uVar24 < (ShaderParameterInfo **)(local_7b8._8_8_ + local_798._8_8_)) {
    p_Var25 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
               *)(ShaderParameterInfo **)0xf;
    if ((pointer)local_7b8._M_allocated_capacity != (pointer)&local_7a8) {
      p_Var25 = local_7a8;
    }
    if ((ShaderParameterInfo **)(local_7b8._8_8_ + local_798._8_8_) <= p_Var25) {
      plVar19 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_7b8,0,(char *)0x0,local_798._0_8_);
      goto LAB_002dbd64;
    }
  }
  plVar19 = (long *)std::__cxx11::string::_M_append(local_798,local_7b8._M_allocated_capacity);
LAB_002dbd64:
  pSVar27 = (pointer)(plVar19 + 2);
  if ((pointer)*plVar19 == pSVar27) {
    local_7e0[0x10] = pSVar27->storageQualifier;
    local_7e0[0x11] = pSVar27->interpolationQualifier;
    local_7e0[0x12] = (pSVar27->GSAttribs).PrimType;
    local_7e0[0x13] = (pSVar27->GSAttribs).Stream;
    local_7e0[0x14] = pSVar27->HSAttribs;
    local_7e0._21_3_ = *(undefined3 *)&pSVar27->field_0x5;
    local_7e0._24_8_ = plVar19[3];
    local_7e0._0_8_ = pSVar22;
  }
  else {
    local_7e0[0x10] = pSVar27->storageQualifier;
    local_7e0[0x11] = pSVar27->interpolationQualifier;
    local_7e0[0x12] = (pSVar27->GSAttribs).PrimType;
    local_7e0[0x13] = (pSVar27->GSAttribs).Stream;
    local_7e0[0x14] = pSVar27->HSAttribs;
    local_7e0._21_3_ = *(undefined3 *)&pSVar27->field_0x5;
    local_7e0._0_8_ = (pointer)*plVar19;
  }
  local_7e0._8_8_ = plVar19[1];
  *plVar19 = (long)pSVar27;
  plVar19[1] = 0;
  pSVar27->storageQualifier = Unknown;
  std::__cxx11::string::operator=((string *)local_6b8,(string *)local_7e0);
  if ((pointer)local_7e0._0_8_ != pSVar22) {
    operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
  }
  if ((pointer)local_7b8._M_allocated_capacity != (pointer)&local_7a8) {
    operator_delete((void *)local_7b8._M_allocated_capacity,(long)local_7a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._0_8_ != &local_788) {
    operator_delete((void *)local_798._0_8_,local_788._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._0_8_ != &local_768) {
    operator_delete((void *)local_778._0_8_,CONCAT71(local_768._1_7_,local_768._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._0_8_ != &local_728) {
    operator_delete((void *)local_738._0_8_,local_728._0_8_ + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  std::__cxx11::stringstream::~stringstream(local_650);
  std::ios_base::~ios_base(aiStack_5d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_4c8);
  std::ios_base::~ios_base(aiStack_448);
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_690);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderArguments(TokenListType::iterator&          TypeToken,
                                                                          std::vector<ShaderParameterInfo>& Params,
                                                                          String&                           Globals,
                                                                          std::stringstream&                ReturnHandlerSS,
                                                                          String&                           Prologue)
{
    auto Token = TypeToken;
    // [...]
    // HSOutput main(InputPatch<VSOutput, 1> inputPatch, uint uCPID : SV_OutputControlPointID)
    // ^
    enum class Domain
    {
        undefined,
        tri,
        quad,
        isoline
    } domain = Domain::undefined;
    enum class Partitioning
    {
        undefined,
        integer,
        fractional_even,
        fractional_odd,
        pow2
    } partitioning = Partitioning::undefined;
    enum class OutputTopology
    {
        undefined,
        point,
        line,
        triangle_cw,
        triangle_ccw
    } topology = OutputTopology::undefined;

    std::unordered_map<HashMapStringKey, String> Attributes;
    ProcessShaderAttributes(Token, Attributes);

    auto DomainIt = Attributes.find("domain");
    if (DomainIt != Attributes.end())
    {
        if (DomainIt->second == "tri")
            domain = Domain::tri;
        else if (DomainIt->second == "quad")
            domain = Domain::quad;
        else if (DomainIt->second == "isoline")
            domain = Domain::isoline;
        else
            LOG_ERROR_AND_THROW("Unexpected domain value \"", DomainIt->second, "\". String constant \"tri\", \"quad\" or \"isoline\" expected");
    }

    auto PartitioningIt = Attributes.find("partitioning");
    if (PartitioningIt != Attributes.end())
    {
        if (PartitioningIt->second == "integer")
            partitioning = Partitioning::integer;
        else if (PartitioningIt->second == "fractional_even")
            partitioning = Partitioning::fractional_even;
        else if (PartitioningIt->second == "fractional_odd")
            partitioning = Partitioning::fractional_odd;
        else if (PartitioningIt->second == "pow2")
            partitioning = Partitioning::pow2;
        else
            LOG_ERROR_AND_THROW("Unexpected partitioning \"", PartitioningIt->second, "\". String constant \"integer\", \"fractional_even\", \"fractional_odd\", or \"pow2\" expected");
    }

    auto TopologyIt = Attributes.find("outputtopology");
    if (TopologyIt != Attributes.end())
    {
        if (TopologyIt->second == "point")
            topology = OutputTopology::point;
        else if (TopologyIt->second == "line")
            topology = OutputTopology::line;
        else if (TopologyIt->second == "triangle_cw")
            topology = OutputTopology::triangle_cw;
        else if (TopologyIt->second == "triangle_ccw")
            topology = OutputTopology::triangle_ccw;
        else
            LOG_ERROR_AND_THROW("Unexpected topology \"", TopologyIt->second, "\". String constant \"point\", \"line\", \"triangle_cw\", or \"triangle_ccw\" expected");
    }

    auto ConstFuncIt = Attributes.find("patchconstantfunc");
    if (ConstFuncIt == Attributes.end())
        LOG_ERROR_AND_THROW("Hull shader patch constant function is not specified. Use \"patchconstantfunc\" attribute");

    //auto MaxTessFactorIt = Attributes.find("maxtessfactor");
    auto NumControlPointsIt = Attributes.find("outputcontrolpoints");
    if (NumControlPointsIt == Attributes.end())
        LOG_ERROR_AND_THROW("Number of output control points is not specified. Use \"outputcontrolpoints\" attribute");
    const Char* NumControlPoints = NumControlPointsIt->second.c_str();

    bool        bConstFuncTakesInputPatch = false;
    const Char* ConstantFunc              = ConstFuncIt->second.c_str();
    ProcessHullShaderConstantFunction(ConstantFunc, bConstFuncTakesInputPatch);

    stringstream GlobalsSS;
    (void)domain;
    (void)partitioning;
    (void)topology;
    // In glsl, domain, partitioning, and topology are properties of tessellation evaluation
    // shader rather than tessellation control shader

    /*GlobalsSS << "layout(";
    switch (domain)
    {
        case Domain::tri:     GlobalsSS << "triangles"; break;
        case Domain::isoline: GlobalsSS << "isolines";  break;
        case Domain::quad:    GlobalsSS << "quads";     break;
        default: LOG_ERROR_AND_THROW( "Hull shader must specify domain" );
    }
    switch (partitioning)
    {
        case Partitioning::integer:         GlobalsSS << ", equal_spacing";           break;
        case Partitioning::fractional_even: GlobalsSS << ", fractional_even_spacing"; break;
        case Partitioning::fractional_odd:  GlobalsSS << ", fractional_odd_spacing";  break;
        case Partitioning::pow2:
            LOG_WARNING_MESSAGE( "OpenGL does not support pow2 partitioning. Using integer instead" );
            GlobalsSS << ", equal_spacing";
        break;
    }
    switch (topology)
    {
        case OutputTopology::line:  break;
        case OutputTopology::point: break;
        case OutputTopology::triangle_ccw: GlobalsSS << ", ccw"; break;
        case OutputTopology::triangle_cw:  GlobalsSS << ", cw";  break;
    }
    GlobalsSS << ") in;\n";*/
    GlobalsSS << "layout(vertices = " << NumControlPoints << ") out;\n";

    std::stringstream PrologueSS, InterfaceVarsInSS, InterfaceVarsOutSS;
    int               inLocation = 0, outLocation = 0;
    for (const auto& TopLevelParam : Params)
    {
        if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            bool IsPatch = TopLevelParam.HSAttribs.PatchType == ShaderParameterInfo::HSAttributes::InOutPatchType::InputPatch;
            if (IsPatch)
            {
                PrologueSS << "    const int _NumInputPoints = " << TopLevelParam.ArraySize << ";\n"; // gl_MaxPatchVertices
                PrologueSS << "    " << TopLevelParam.Type << ' ' << TopLevelParam.Name << "[_NumInputPoints];\n";
                // Iterate of the actual number of vertices in the input patch
                PrologueSS << "    for(int i=0; i < gl_PatchVerticesIn; ++i)\n    {\n";
            }

            ProcessShaderArgument(
                TopLevelParam, HSInd, InVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, String Getter) //
                {
                    // All inputs from vertex shaders to the TCS are aggregated into arrays, based on the size of the input patch.
                    // The size of these arrays is the number of input patches provided by the patch primitive.
                    // https://www.khronos.org/opengl/wiki/Tessellation_Control_Shader#Inputs
                    String FullIndexedParamName = BuildParameterName(MemberStack, '.', "", "", IsPatch ? "[i]" : "");
                    if (IsPatch)
                        PrologueSS << "    ";
                    if (!Getter.empty())
                        PrologueSS << "    " << Getter << '(' << FullIndexedParamName << ");\n";
                    else
                    {
                        auto VarName      = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_hsin_" : "_");
                        auto InputVarName = VarName + (IsPatch ? "[i]" : "");
                        // User-defined inputs can be declared as unbounded arrays
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? inLocation++ : -1,
                                           GetInterpolationQualifier(Param), "in",
                                           Param.Type, VarName + (IsPatch ? "[]" : ""), InterfaceVarsInSS);
                        InitVariable(FullIndexedParamName, InputVarName, PrologueSS);
                    }
                } //
            );

            if (IsPatch)
            {
                PrologueSS << "    }\n";
                // Add call to the constant function
                // Multiple TCS invocations for the same patch can write to the same tessellation level variable,
                // so long as they are all computing and writing the exact same value.
                // https://www.khronos.org/opengl/wiki/Tessellation_Control_Shader#Outputs
                PrologueSS << "    " << ConstantFunc << '(' << (bConstFuncTakesInputPatch ? TopLevelParam.Name : "") << ");\n";
            }
        }
        else if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Out ||
                 TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret)
        {
            ProcessShaderArgument(
                TopLevelParam, HSInd, OutVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Setter) //
                {
                    String SrcParamName = BuildParameterName(MemberStack, '.', "", Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret ? "_RET_VAL_" : "");
                    if (!Setter.empty())
                        ReturnHandlerSS << Setter << '(' << SrcParamName << ");\\\n";
                    else
                    {
                        auto OutputVarName = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_hsout_" : "_");
                        // Per-vertex outputs are aggregated into arrays.
                        // https://www.khronos.org/opengl/wiki/Tessellation_Control_Shader#Outputs
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? outLocation++ : -1,
                                           GetInterpolationQualifier(Param), "out",
                                           Param.Type, OutputVarName + "[]", InterfaceVarsOutSS);
                        // A TCS can only ever write to the per-vertex output variable that corresponds to their invocation,
                        // so writes to per-vertex outputs must be of the form vertexTexCoord[gl_InvocationID]
                        ReturnHandlerSS << OutputVarName << "[gl_InvocationID] = " << SrcParamName << ";\\\n";
                    }
                } //
            );
        }
    }

    Prologue = PrologueSS.str();
    Globals  = GlobalsSS.str() + InterfaceVarsInSS.str() + InterfaceVarsOutSS.str();
}